

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::ReadBuffersResponse_Slice::ReadBuffersResponse_Slice
          (ReadBuffersResponse_Slice *this,ReadBuffersResponse_Slice *param_1)

{
  pointer pcVar1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ReadBuffersResponse_Slice_003c9098;
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  pcVar1 = (param_1->data_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->data_,pcVar1,pcVar1 + (param_1->data_)._M_string_length);
  this->last_slice_for_packet_ = param_1->last_slice_for_packet_;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  pcVar1 = (param_1->unknown_fields_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->unknown_fields_,pcVar1,
             pcVar1 + (param_1->unknown_fields_)._M_string_length);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ReadBuffersResponse_Slice::ReadBuffersResponse_Slice(const ReadBuffersResponse_Slice&) = default;